

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::InsertToVarAtDefInTryRegion(GlobOpt *this,Instr *instr,Opnd *dstOpnd)

{
  RegionType RVar1;
  bool bVar2;
  BOOLEAN BVar3;
  RegOpnd *pRVar4;
  StackSym *pSVar5;
  Region *pRVar6;
  RegOpnd *regOpnd;
  StackSym *varSym;
  StackSym *sym;
  Opnd *dstOpnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  RVar1 = Region::GetType(this->currentRegion);
  if (((RVar1 == RegionTypeTry) ||
      (RVar1 = Region::GetType(this->currentRegion), RVar1 == RegionTypeFinally)) &&
     (bVar2 = IR::Opnd::IsRegOpnd(dstOpnd), bVar2)) {
    pRVar4 = IR::Opnd::AsRegOpnd(dstOpnd);
    bVar2 = StackSym::HasByteCodeRegSlot(pRVar4->m_sym);
    if (bVar2) {
      pRVar4 = IR::Opnd::AsRegOpnd(dstOpnd);
      pSVar5 = pRVar4->m_sym;
      bVar2 = StackSym::IsVar(pSVar5);
      if (!bVar2) {
        pSVar5 = StackSym::GetVarEquivSym(pSVar5,(Func *)0x0);
        RVar1 = Region::GetType(this->currentRegion);
        if ((RVar1 != RegionTypeTry) ||
           (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                              (this->currentRegion->writeThroughSymbolsSet,(pSVar5->super_Sym).m_id)
           , BVar3 == '\0')) {
          RVar1 = Region::GetType(this->currentRegion);
          if (RVar1 != RegionTypeFinally) {
            return;
          }
          pRVar6 = Region::GetMatchingTryRegion(this->currentRegion);
          BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pRVar6->writeThroughSymbolsSet,(pSVar5->super_Sym).m_id);
          if (BVar3 == '\0') {
            return;
          }
        }
        pRVar4 = IR::RegOpnd::New(pSVar5,TyVar,instr->m_func);
        ToVar(this,instr->m_next,pRVar4,this->currentBlock,(Value *)0x0,false);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::InsertToVarAtDefInTryRegion(IR::Instr * instr, IR::Opnd * dstOpnd)
{
    if ((this->currentRegion->GetType() == RegionTypeTry || this->currentRegion->GetType() == RegionTypeFinally) &&
        dstOpnd->IsRegOpnd() && dstOpnd->AsRegOpnd()->m_sym->HasByteCodeRegSlot())
    {
        StackSym * sym = dstOpnd->AsRegOpnd()->m_sym;
        if (sym->IsVar())
        {
            return;
        }

        StackSym * varSym = sym->GetVarEquivSym(nullptr);
        if ((this->currentRegion->GetType() == RegionTypeTry && this->currentRegion->writeThroughSymbolsSet->Test(varSym->m_id)) ||
            ((this->currentRegion->GetType() == RegionTypeFinally && this->currentRegion->GetMatchingTryRegion()->writeThroughSymbolsSet->Test(varSym->m_id))))
        {
            IR::RegOpnd * regOpnd = IR::RegOpnd::New(varSym, IRType::TyVar, instr->m_func);
            this->ToVar(instr->m_next, regOpnd, this->currentBlock, NULL, false);
        }
    }
}